

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

char * mjs::string_value(value_type t)

{
  wostream *this;
  wstring local_1d0 [32];
  wstring_view local_1b0 [2];
  wostringstream local_190 [8];
  wostringstream _woss;
  char *pcStack_10;
  value_type t_local;
  
  switch(t) {
  case undefined:
    pcStack_10 = "undefined";
    break;
  case null:
    pcStack_10 = "null";
    break;
  case boolean:
    pcStack_10 = "boolean";
    break;
  case number:
    pcStack_10 = "number";
    break;
  case string:
    pcStack_10 = "string";
    break;
  case object:
    pcStack_10 = "object";
    break;
  case reference:
    pcStack_10 = "reference";
    break;
  default:
    std::__cxx11::wostringstream::wostringstream(local_190);
    this = std::operator<<((wostream *)local_190,"Not implemented: ");
    std::wostream::operator<<(this,t);
    std::__cxx11::wostringstream::str();
    local_1b0[0] = (wstring_view)
                   std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1d0);
    throw_runtime_error(local_1b0,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                        ,0x1e);
  }
  return pcStack_10;
}

Assistant:

const char* string_value(value_type t) {
    switch (t) {
    case value_type::undefined: return "undefined";
    case value_type::null:      return "null";
    case value_type::boolean:   return "boolean";
    case value_type::number:    return "number";
    case value_type::string:    return "string";
    case value_type::object:    return "object";
    case value_type::reference: return "reference";
    }
    NOT_IMPLEMENTED((int)t);
}